

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O0

StreamExpressionSyntax * __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::operator[]
          (SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *this,size_t index)

{
  reference this_00;
  SyntaxNode *this_01;
  StreamExpressionSyntax *pSVar1;
  size_t index_local;
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *this_local;
  
  this_00 = nonstd::span_lite::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::
            operator[](&this->elements,index << 1);
  this_01 = TokenOrSyntax::node(this_00);
  pSVar1 = SyntaxNode::as<slang::syntax::StreamExpressionSyntax>(this_01);
  return pSVar1;
}

Assistant:

const T* operator[](size_t index) const {
        index <<= 1;
        return &elements[index].node()->template as<T>();
    }